

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O0

void get_dir_list(int argc,char **argv)

{
  _Bool _Var1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  BinarySink *bs;
  StripCtrlChars *scc;
  stdio_sink ss;
  char *pcStack_50;
  char c;
  char *q;
  char *p;
  char *cmd;
  char *src;
  char *user;
  char *host;
  char *wsrc;
  char **argv_local;
  int argc_local;
  
  pcVar4 = *argv;
  pcVar2 = colon(pcVar4);
  if (pcVar2 != (char *)0x0) {
    cmd = pcVar2 + 1;
    *pcVar2 = '\0';
    if (*cmd == '\0') {
      cmd = ".";
    }
    pcVar2 = strrchr(pcVar4,0x40);
    if (pcVar2 == (char *)0x0) {
      src = (char *)0x0;
      user = pcVar4;
    }
    else {
      user = pcVar2 + 1;
      *pcVar2 = '\0';
      src = pcVar4;
      if (*pcVar4 == '\0') {
        src = (char *)0x0;
      }
    }
    sVar3 = strlen(cmd);
    pcVar4 = (char *)safemalloc(sVar3 * 4 + 100,1,0);
    strcpy(pcVar4,"ls -la \'");
    sVar3 = strlen(pcVar4);
    q = pcVar4 + sVar3;
    for (pcStack_50 = cmd; *pcStack_50 != '\0'; pcStack_50 = pcStack_50 + 1) {
      if (*pcStack_50 == '\'') {
        builtin_strncpy(q,"\'\\\'\'",4);
        q = q + 4;
      }
      else {
        *q = *pcStack_50;
        q = q + 1;
      }
    }
    *q = '\'';
    q[1] = '\0';
    do_cmd(user,src,pcVar4);
    safefree(pcVar4);
    if ((using_sftp & 1U) == 0) {
      stdio_sink_init((stdio_sink *)&scc,_stdout);
      bs = stripctrl_new((BinarySink *)&ss,false,L'\0')->binarysink_;
      while (_Var1 = ssh_scp_recv((void *)((long)&ss.binarysink_[0].binarysink_ + 7),1), _Var1) {
        BinarySink_put_byte(bs,ss.binarysink_[0].binarysink_._7_1_);
      }
      stripctrl_free((StripCtrlChars *)bs);
    }
    else {
      scp_sftp_listdir(cmd);
    }
    return;
  }
  bump("Local file listing not supported");
}

Assistant:

static void get_dir_list(int argc, char *argv[])
{
    char *wsrc, *host, *user;
    const char *src;
    char *cmd, *p;
    const char *q;
    char c;

    wsrc = argv[0];

    /* Separate host from filename */
    host = wsrc;
    wsrc = colon(wsrc);
    if (wsrc == NULL)
        bump("Local file listing not supported");
    *wsrc++ = '\0';
    /* Substitute "." for empty filename */
    if (*wsrc == '\0')
        src = ".";
    else
        src = wsrc;

    /* Separate username and hostname */
    user = host;
    host = strrchr(host, '@');
    if (host == NULL) {
        host = user;
        user = NULL;
    } else {
        *host++ = '\0';
        if (*user == '\0')
            user = NULL;
    }

    cmd = snewn(4 * strlen(src) + 100, char);
    strcpy(cmd, "ls -la '");
    p = cmd + strlen(cmd);
    for (q = src; *q; q++) {
        if (*q == '\'') {
            *p++ = '\'';
            *p++ = '\\';
            *p++ = '\'';
            *p++ = '\'';
        } else {
            *p++ = *q;
        }
    }
    *p++ = '\'';
    *p = '\0';

    do_cmd(host, user, cmd);
    sfree(cmd);

    if (using_sftp) {
        scp_sftp_listdir(src);
    } else {
        stdio_sink ss;
        stdio_sink_init(&ss, stdout);
        StripCtrlChars *scc = stripctrl_new(
            BinarySink_UPCAST(&ss), false, L'\0');
        while (ssh_scp_recv(&c, 1))
            put_byte(scc, c);
        stripctrl_free(scc);
    }
}